

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::MonitorTask::checkArguments
          (MonitorTask *this,ASTContext *context,Args *args,SourceRange range,Expression *iterOrThis
          )

{
  bool bVar1;
  Type *this_00;
  iterator ppEVar2;
  Expression *arg;
  iterator __end3;
  iterator __begin3;
  Args *__range3;
  MonitorVisitor visitor;
  Type *result;
  Expression *iterOrThis_local;
  Args *args_local;
  ASTContext *context_local;
  MonitorTask *this_local;
  SourceRange range_local;
  
  visitor.context = (ASTContext *)range.startLoc;
  this_00 = builtins::DisplayTask::checkArguments
                      (&this->super_DisplayTask,context,args,range,iterOrThis);
  bVar1 = Type::isError(this_00);
  if (!bVar1) {
    MonitorVisitor::MonitorVisitor((MonitorVisitor *)&__range3,context);
    __end3 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
             begin(args);
    ppEVar2 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
              end(args);
    for (; __end3 != ppEVar2; __end3 = __end3 + 1) {
      Expression::visit<slang::ast::builtins::MonitorVisitor&>(*__end3,(MonitorVisitor *)&__range3);
    }
  }
  return this_00;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression* iterOrThis) const final {
        auto& result = DisplayTask::checkArguments(context, args, range, iterOrThis);
        if (result.isError())
            return result;

        // Additional restriction for monitor tasks: automatic variables cannot be referenced.
        MonitorVisitor visitor(context);
        for (auto arg : args)
            arg->visit(visitor);

        return result;
    }